

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Matcher<const_std::tuple<fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_&>
* testing::
  A<std::tuple<fmt::BasicStringRef<char>,mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>>>const&>const&>
            (void)

{
  MatcherInterface<const_std::tuple<fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_&>
  *pMVar1;
  Matcher<const_std::tuple<fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_&>
  *in_RDI;
  
  pMVar1 = (MatcherInterface<const_std::tuple<fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_&>
            *)operator_new(8);
  (pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_00262f70;
  (in_RDI->
  super_MatcherBase<const_std::tuple<fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_&>
  ).impl_.value_ = pMVar1;
  (in_RDI->
  super_MatcherBase<const_std::tuple<fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_&>
  ).impl_.link_.next_ =
       &(in_RDI->
        super_MatcherBase<const_std::tuple<fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_&>
        ).impl_.link_;
  (in_RDI->
  super_MatcherBase<const_std::tuple<fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_&>
  )._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00262f38;
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }